

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensus.hpp
# Opt level: O2

void __thiscall
opengv::sac::SampleConsensus<opengv::sac_problems::point_cloud::PointCloudSacProblem>::
~SampleConsensus(SampleConsensus<opengv::sac_problems::point_cloud::PointCloudSacProblem> *this)

{
  this->_vptr_SampleConsensus = (_func_int **)&PTR__SampleConsensus_00187b18;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sac_model_).
              super___shared_ptr<opengv::sac_problems::point_cloud::PointCloudSacProblem,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->inliers_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->model_).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

opengv::sac::SampleConsensus<P>::~SampleConsensus(){}